

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O0

void __thiscall
Genome::AddPromoter(Genome *this,string *name,int start,int stop,
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                   *interactions)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  mapped_type *this_00;
  undefined1 local_38 [8];
  Ptr promoter;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *interactions_local;
  int stop_local;
  int start_local;
  string *name_local;
  Genome *this_local;
  
  promoter.super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)interactions;
  interactions_local._0_4_ = stop;
  interactions_local._4_4_ = start;
  _stop_local = name;
  name_local = (string *)this;
  std::
  make_shared<BindingSite,std::__cxx11::string_const&,int&,int&,std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
             (int *)name,(int *)((long)&interactions_local + 4),
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
              *)&interactions_local);
  std::
  vector<Interval<std::shared_ptr<BindingSite>,unsigned_long>,std::allocator<Interval<std::shared_ptr<BindingSite>,unsigned_long>>>
  ::emplace_back<int&,int&,std::shared_ptr<BindingSite>&>
            ((vector<Interval<std::shared_ptr<BindingSite>,unsigned_long>,std::allocator<Interval<std::shared_ptr<BindingSite>,unsigned_long>>>
              *)&(this->super_Polymer).binding_intervals_,(int *)((long)&interactions_local + 4),
             (int *)&interactions_local,(shared_ptr<BindingSite> *)local_38);
  _Var1 = promoter.super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>_>_>
            ::operator[](&this->bindings_,_stop_local);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::operator=(this_00,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                       *)_Var1._M_pi);
  std::shared_ptr<BindingSite>::~shared_ptr((shared_ptr<BindingSite> *)local_38);
  return;
}

Assistant:

void Genome::AddPromoter(const std::string &name, int start, int stop,
                         const std::map<std::string, double> &interactions) {
  BindingSite::Ptr promoter =
      std::make_shared<BindingSite>(name, start, stop, interactions);
  binding_intervals_.emplace_back(start, stop, promoter);
  bindings_[name] = interactions;
}